

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall VmaStringBuilder::AddNumber(VmaStringBuilder *this,uint64_t num)

{
  bool bVar1;
  byte *pStr;
  char buf [21];
  byte local_5 [5];
  
  pStr = local_5 + 1;
  local_5[1] = 0;
  do {
    pStr[-1] = (char)num + (char)(num / 10) * -10 | 0x30;
    pStr = pStr + -1;
    bVar1 = 9 < num;
    num = num / 10;
  } while (bVar1);
  Add(this,(char *)pStr);
  return;
}

Assistant:

void VmaStringBuilder::AddNumber(uint64_t num)
{
    char buf[21];
    buf[20] = '\0';
    char* p = &buf[20];
    do
    {
        *--p = '0' + (num % 10);
        num /= 10;
    } while (num);
    Add(p);
}